

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepFace * __thiscall ON_BrepFace::operator=(ON_BrepFace *this,ON_BrepFace *src)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  shared_ptr<const_ON_Mesh> local_68;
  shared_ptr<const_ON_Mesh> local_58;
  shared_ptr<const_ON_Mesh> local_48 [2];
  lock_guard<std::recursive_mutex> local_28;
  lock_guard<std::recursive_mutex> lock2;
  lock_guard<std::recursive_mutex> lock;
  ON_BrepFace *src_local;
  ON_BrepFace *this_local;
  
  if (src != this) {
    ON_SurfaceProxy::operator=(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
    this->m_face_user = src->m_face_user;
    this->m_status = src->m_status;
    this->m_face_index = src->m_face_index;
    ON_SimpleArray<int>::operator=(&this->m_li,&src->m_li);
    this->m_si = src->m_si;
    this->m_bRev = (bool)(src->m_bRev & 1);
    this->m_face_material_channel = src->m_face_material_channel;
    uVar2 = (src->m_face_uuid).Data2;
    uVar3 = (src->m_face_uuid).Data3;
    uVar1 = *(undefined8 *)(src->m_face_uuid).Data4;
    (this->m_face_uuid).Data1 = (src->m_face_uuid).Data1;
    (this->m_face_uuid).Data2 = uVar2;
    (this->m_face_uuid).Data3 = uVar3;
    *(undefined8 *)(this->m_face_uuid).Data4 = uVar1;
    (this->m_per_face_color).field_0 = (src->m_per_face_color).field_0;
    std::lock_guard<std::recursive_mutex>::lock_guard(&lock2,&this->m_pImpl->m_mesh_mutex);
    std::lock_guard<std::recursive_mutex>::lock_guard(&local_28,&src->m_pImpl->m_mesh_mutex);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)src->m_pImpl);
    if (bVar4) {
      std::shared_ptr<const_ON_Mesh>::shared_ptr(local_48,&src->m_pImpl->m_render_mesh);
    }
    else {
      std::shared_ptr<const_ON_Mesh>::shared_ptr(local_48,(nullptr_t)0x0);
    }
    std::shared_ptr<const_ON_Mesh>::operator=(&this->m_pImpl->m_render_mesh,local_48);
    std::shared_ptr<const_ON_Mesh>::~shared_ptr(local_48);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&src->m_pImpl->m_analysis_mesh)
    ;
    if (bVar4) {
      std::shared_ptr<const_ON_Mesh>::shared_ptr(&local_58,&src->m_pImpl->m_analysis_mesh);
    }
    else {
      std::shared_ptr<const_ON_Mesh>::shared_ptr(&local_58,(nullptr_t)0x0);
    }
    std::shared_ptr<const_ON_Mesh>::operator=(&this->m_pImpl->m_analysis_mesh,&local_58);
    std::shared_ptr<const_ON_Mesh>::~shared_ptr(&local_58);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&src->m_pImpl->m_preview_mesh);
    if (bVar4) {
      std::shared_ptr<const_ON_Mesh>::shared_ptr(&local_68,&src->m_pImpl->m_preview_mesh);
    }
    else {
      std::shared_ptr<const_ON_Mesh>::shared_ptr(&local_68,(nullptr_t)0x0);
    }
    std::shared_ptr<const_ON_Mesh>::operator=(&this->m_pImpl->m_preview_mesh,&local_68);
    std::shared_ptr<const_ON_Mesh>::~shared_ptr(&local_68);
    std::lock_guard<std::recursive_mutex>::~lock_guard(&local_28);
    std::lock_guard<std::recursive_mutex>::~lock_guard(&lock2);
  }
  return this;
}

Assistant:

ON_BrepFace& ON_BrepFace::operator=(const ON_BrepFace& src)
{
  if ( &src != this ) 
  {
    // do not copy m_brep pointer
    ON_SurfaceProxy::operator=(src);
    m_face_user   = src.m_face_user;
    m_status      = src.m_status;
    m_face_index  = src.m_face_index;
    m_li    = src.m_li;
    m_si    = src.m_si;
    m_bRev  = src.m_bRev;
    m_face_material_channel = src.m_face_material_channel;
    m_face_uuid = src.m_face_uuid;
    m_per_face_color = src.m_per_face_color;

    std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);
    std::lock_guard<std::recursive_mutex> lock2(src.m_pImpl->m_mesh_mutex);

    m_pImpl->m_render_mesh   = src.m_pImpl->m_render_mesh   ? src.m_pImpl->m_render_mesh   : nullptr;
    m_pImpl->m_analysis_mesh = src.m_pImpl->m_analysis_mesh ? src.m_pImpl->m_analysis_mesh : nullptr;
    m_pImpl->m_preview_mesh  = src.m_pImpl->m_preview_mesh  ? src.m_pImpl->m_preview_mesh  : nullptr;
  }
  return *this;
}